

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O1

void table<Result<unsigned_int,double>>
               (ostream *os,
               vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
               *rs)

{
  pointer pRVar1;
  char cVar2;
  Result<unsigned_int,_double> *r;
  pointer r_00;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"<div class=\"centercontainer\">",0x1d);
  cVar2 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<table id=\"results\">",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<thead>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<tr>",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th></th>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th colspan=5>Absolute error</th>",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th colspan=5>Relative error</th>",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th></th>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th></th>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"</tr>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<tr>",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Method</th>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Min.</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Max.</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Mean</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Median</th>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Var.</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Min.</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Max.</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Mean</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Median</th>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>Var.</th>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<th>stddev</th>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"<th>Execution time</br>[ns / call]</th>",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"</tr>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"</thead>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  pRVar1 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (r_00 = (rs->
              super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start; r_00 != pRVar1; r_00 = r_00 + 1) {
    td<Result<unsigned_int,double>>(os,r_00);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"</table>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"</div>",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void table(std::ostream& os, const std::vector<ResultT>& rs)
{
    os << "<div class=\"centercontainer\">" << std::endl;
    os << "<table id=\"results\">" << std::endl;
    os << "<thead>" << std::endl;
    os << "<tr>" << std::endl;
    os << "<th></th>" << std::endl;
    os << "<th colspan=5>Absolute error</th>" << std::endl;
    os << "<th colspan=5>Relative error</th>" << std::endl;
    os << "<th></th>" << std::endl;
    os << "<th></th>" << std::endl;
    os << "</tr>" << std::endl;
    os << "<tr>" << std::endl;
    os << "<th>Method</th>" << std::endl;
    os << "<th>Min.</th>" << std::endl;
    os << "<th>Max.</th>" << std::endl;
    os << "<th>Mean</th>" << std::endl;
    os << "<th>Median</th>" << std::endl;
    os << "<th>Var.</th>" << std::endl;
    os << "<th>Min.</th>" << std::endl;
    os << "<th>Max.</th>" << std::endl;
    os << "<th>Mean</th>" << std::endl;
    os << "<th>Median</th>" << std::endl;
    os << "<th>Var.</th>" << std::endl;
    os << "<th>stddev</th>" << std::endl;
    os << "<th>Execution time</br>[ns / call]</th>" << std::endl;
    os << "</tr>" << std::endl;
    os << "</thead>" << std::endl;
    for (const auto& r : rs)
    {
        td(os, r);
    }
    os << "</table>" << std::endl;
    os << "</div>" << std::endl;
}